

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O0

bool __thiscall ON_ParseSettings::IsUnaryMinus(ON_ParseSettings *this,ON__UINT32 c)

{
  ON__UINT32 c_local;
  ON_ParseSettings *this_local;
  
  if (c == 0x2d) {
    if ((this->m_true_default_bits[1] & 0x80) == 0) {
      return true;
    }
  }
  else if (c == 0x2d7) {
    if ((this->m_true_default_bits[1] & 0x100) == 0) {
      return true;
    }
  }
  else if (c == 0x2796) {
    if ((this->m_true_default_bits[1] & 0x200) == 0) {
      return true;
    }
  }
  else if (c == 0xfe63) {
    if ((this->m_true_default_bits[1] & 0x400) == 0) {
      return true;
    }
  }
  else if ((c == 0xff0d) && ((this->m_true_default_bits[1] & 0x800) == 0)) {
    return true;
  }
  return false;
}

Assistant:

bool ON_ParseSettings::IsUnaryMinus(ON__UINT32 c) const
{
  switch(c)
  {
  case 0x002D: // hyphen-minus
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_hyphen_minus_as_unary_minus) )
      return true;
    break;

  case 0x02D7: // modifier letter minus sign
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_modifier_letter_minus_sign_as_unary_minus) )
      return true;
    break;

  case 0x2796: // heavy minus sign
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_heavy_minus_sign_as_unary_minus) )
      return true;
    break;

  case 0xFE63: // small hyphen-minus
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_small_hyphen_minus_as_unary_minus) )
      return true;
    break;

  case 0xFF0D: // fullwidth hyphen-minus
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_fullwidth_hyphen_minus_as_unary_minus) )
      return true;
    break;
  }
  return false;
}